

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsGetRuntimeMemoryLimit(JsRuntimeHandle runtimeHandle,size_t *memoryLimit)

{
  JsErrorCode JVar1;
  JsrtRuntime *runtime;
  
  if (runtimeHandle != (JsRuntimeHandle)0x0) {
    if (memoryLimit == (size_t *)0x0) {
      JVar1 = JsErrorNullArgument;
    }
    else {
      *memoryLimit = 0;
      ThreadContext::ValidateThreadContext(*runtimeHandle);
      *memoryLimit = **(size_t **)(*runtimeHandle + 0x110);
      JVar1 = JsNoError;
    }
    return JVar1;
  }
  return JsErrorInvalidArgument;
}

Assistant:

CHAKRA_API JsGetRuntimeMemoryLimit(_In_ JsRuntimeHandle runtimeHandle, _Out_ size_t * memoryLimit)
{
    VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);
    PARAM_NOT_NULL(memoryLimit);
    *memoryLimit = 0;

    ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
    AllocationPolicyManager * allocPolicyManager = threadContext->GetAllocationPolicyManager();

    *memoryLimit = allocPolicyManager->GetLimit();

    return JsNoError;
}